

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

void prf_header_init(void)

{
  prf_nodeinfo_t *unaff_retaddr;
  
  prf_header_info.load_f = prf_header_load_f;
  prf_header_info.save_f = prf_header_save_f;
  prf_header_info.entry_f = prf_header_entry_f;
  prf_header_info.clone_f = prf_header_clone_f;
  prf_nodeinfo_set(unaff_retaddr);
  return;
}

Assistant:

void
prf_header_init(
    void )
{
    prf_header_info.load_f = prf_header_load_f;
    prf_header_info.save_f = prf_header_save_f;
    prf_header_info.entry_f = prf_header_entry_f;
    prf_header_info.clone_f = prf_header_clone_f;
    prf_nodeinfo_set( &prf_header_info );
}